

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Printer
          (Printer *this,ZeroCopyOutputStream *output,char variable_delimiter)

{
  char variable_delimiter_local;
  ZeroCopyOutputStream *output_local;
  Printer *this_local;
  
  this->variable_delimiter_ = variable_delimiter;
  this->output_ = output;
  this->buffer_ = (char *)0x0;
  this->buffer_size_ = 0;
  this->offset_ = 0;
  std::__cxx11::string::string((string *)&this->indent_);
  this->at_start_of_line_ = true;
  this->failed_ = false;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::map(&this->substitutions_);
  this->annotation_collector_ = (AnnotationCollector *)0x0;
  return;
}

Assistant:

Printer::Printer(ZeroCopyOutputStream* output, char variable_delimiter)
    : variable_delimiter_(variable_delimiter),
      output_(output),
      buffer_(NULL),
      buffer_size_(0),
      offset_(0),
      at_start_of_line_(true),
      failed_(false),
      annotation_collector_(NULL) {}